

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

void __thiscall flow::IRHandler::setEntryBlock(IRHandler *this,BasicBlock *bb)

{
  FILE *pFVar1;
  bool bVar2;
  IRHandler *pIVar3;
  undefined8 uVar4;
  reference puVar5;
  const_iterator local_b0;
  unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> local_a8;
  unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> t;
  string local_98 [32];
  _Self local_78;
  BasicBlock **local_70;
  _List_node_base *local_68;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
  local_60;
  _Self local_58;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_> i;
  allocator<char> local_39;
  string local_38 [32];
  BasicBlock *local_18;
  BasicBlock *bb_local;
  IRHandler *this_local;
  
  local_18 = bb;
  bb_local = (BasicBlock *)this;
  pIVar3 = BasicBlock::getHandler(bb);
  pFVar1 = _stderr;
  if (pIVar3 == (IRHandler *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"BasicBlock must belong to this handler.",&local_39);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s\n",uVar4);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    abort();
  }
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::begin(&this->blocks_);
  local_68 = (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
             ::end(&this->blocks_);
  local_70 = &local_18;
  local_58._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_iterator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>,flow::IRHandler::setEntryBlock(flow::BasicBlock*)::__0>
                 (local_60,(_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                            )local_68,(anon_class_8_1_3fcf64fe_for__M_pred)local_70);
  local_78._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::end(&this->blocks_);
  bVar2 = std::operator!=(&local_58,&local_78);
  pFVar1 = _stderr;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    puVar5 = std::
             _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
             ::operator*(&local_58);
    std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::unique_ptr
              (&local_a8,puVar5);
    std::
    _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
    ::_List_const_iterator(&local_b0,&local_58);
    std::__cxx11::
    list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
    ::erase(&this->blocks_,local_b0);
    std::__cxx11::
    list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
    ::push_front(&this->blocks_,&local_a8);
    std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::~unique_ptr
              (&local_a8);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"BasicBlock must belong to this handler.",
             (allocator<char> *)
             ((long)&t._M_t.
                     super___uniq_ptr_impl<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::BasicBlock_*,_std::default_delete<flow::BasicBlock>_>
                     .super__Head_base<0UL,_flow::BasicBlock_*,_false>._M_head_impl + 7));
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%s\n",uVar4);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&t._M_t.
                     super___uniq_ptr_impl<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::BasicBlock_*,_std::default_delete<flow::BasicBlock>_>
                     .super__Head_base<0UL,_flow::BasicBlock_*,_false>._M_head_impl + 7));
  abort();
}

Assistant:

void IRHandler::setEntryBlock(BasicBlock* bb) {
  FLOW_ASSERT(bb->getHandler(), "BasicBlock must belong to this handler.");

  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == bb; });
  FLOW_ASSERT(i != blocks_.end(), "BasicBlock must belong to this handler.");
  std::unique_ptr<BasicBlock> t = std::move(*i);
  blocks_.erase(i);
  blocks_.push_front(std::move(t));
}